

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::GetImplibGNUtoMS
          (cmGeneratorTarget *this,string *config,string *gnuName,string *out,char *newExt)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  cmAlphaNum local_a8;
  string local_78;
  cmAlphaNum local_58;
  
  bVar1 = HasImplibGNUtoMS(this,config);
  if ((bVar1) && (6 < gnuName->_M_string_length)) {
    std::__cxx11::string::substr((ulong)&local_a8,(ulong)gnuName);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_a8,".dll.a");
    std::__cxx11::string::~string((string *)&local_a8);
    if (bVar1) {
      local_b8._M_str = (gnuName->_M_dataplus)._M_p;
      local_b8._M_len = gnuName->_M_string_length;
      local_a8.View_ =
           std::basic_string_view<char,_std::char_traits<char>_>::substr
                     (&local_b8,0,local_b8._M_len - 6);
      local_58.View_._M_str = ".lib";
      if (newExt != (char *)0x0) {
        local_58.View_._M_str = newExt;
      }
      local_58.View_._M_len = strlen(local_58.View_._M_str);
      cmStrCat<>(&local_78,&local_a8,&local_58);
      std::__cxx11::string::operator=((string *)out,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      return true;
    }
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::GetImplibGNUtoMS(std::string const& config,
                                         std::string const& gnuName,
                                         std::string& out,
                                         const char* newExt) const
{
  if (this->HasImplibGNUtoMS(config) && gnuName.size() > 6 &&
      gnuName.substr(gnuName.size() - 6) == ".dll.a") {
    out = cmStrCat(cm::string_view(gnuName).substr(0, gnuName.size() - 6),
                   newExt ? newExt : ".lib");
    return true;
  }
  return false;
}